

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult>::addCase<2,4>
          (MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult> *this,
          Context *ctx,TestCaseGroup *group)

{
  char *this_00;
  TestCaseGroup *context;
  char *__s;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *func;
  PrecisionCase *node;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *name;
  TestCaseGroup *group_local;
  Context *ctx_local;
  MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult> *this_local;
  
  name = (char *)group;
  group_local = (TestCaseGroup *)ctx;
  ctx_local = (Context *)this;
  __s = dataTypeNameOf<tcu::Matrix<float,2,4>>();
  context = group_local;
  this_00 = name;
  local_28 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  func = (Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *)instance<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult<2,4>>();
  node = createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                   ((Context *)context,&local_48,func);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)node);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void				addCase			(const Context& ctx, TestCaseGroup* group) const
	{
		const char*	const name = dataTypeNameOf<Matrix<float, Rows, Cols> >();

		group->addChild(createFuncCase(ctx, name, instance<GenF<Rows, Cols> >()));
	}